

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O1

uint64_t highwayhash::(anonymous_namespace)::RunHighway<2u>(void *param_1,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  V128<unsigned_long> t_1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  V128<unsigned_long> t;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar19 [16];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  HHStateT<2U> state;
  char in [1024];
  HHStateSSE41 local_488;
  long local_408 [129];
  
  local_408[0]._0_1_ = (char)size;
  local_488.v0L.v_[1] = -0x5bf6c7ddd660ce2f;
  local_488.v0L.v_[0] = -0x24192a2a01b331d1;
  uVar30 = 0x13198a2e03707346;
  uVar33 = 0x243f6a8885a308d0;
  lVar27 = 0x3bd39e10cb0ef593;
  local_488.v1L.v_[1] = -0x3f530e974a0e7574;
  local_488.v1H.v_[0] = -0x41ab9932cb16f394;
  local_488.v1H.v_[1] = 0x452821e538d01377;
  uVar18 = 0xdbe6d5d5fe4cce2f;
  uVar22 = 0xa4093822299f31d0;
  local_488.mul0L.v_[0] = 0xdbe6d5d5fe4cce2f;
  local_488.mul0L.v_[1] = 0xa4093822299f31d0;
  uVar24 = 0x13198a2e03707344;
  uVar26 = 0x243f6a8885a308d3;
  local_488.mul0H.v_[0] = 0x13198a2e03707344;
  local_488.mul0H.v_[1] = 0x243f6a8885a308d3;
  uVar31 = 0x3bd39e10cb0ef593;
  uVar34 = 0xc0acf169b5f18a8c;
  local_488.mul1L.v_[0] = 0x3bd39e10cb0ef593;
  local_488.mul1L.v_[1] = 0xc0acf169b5f18a8c;
  uVar16 = 0xbe5466cf34e90c6c;
  uVar20 = 0x452821e638d01377;
  local_488.mul1H.v_[0] = 0xbe5466cf34e90c6c;
  local_488.mul1H.v_[1] = 0x452821e638d01377;
  uVar14 = (ulong)((uint)size & 0x1f);
  uVar8 = size & 0xffffffffffffffe0;
  local_488.v0H.v_[0] = 0x13198a2e03707346;
  local_488.v0H.v_[1] = 0x243f6a8885a308d0;
  local_488.v1L.v_[0] = 0x3bd39e10cb0ef593;
  if (uVar8 != 0) {
    uVar7 = 0;
    do {
      uVar23 = lVar27 + *(long *)((long)local_408 + uVar7) + uVar18;
      uVar25 = local_488.v1L.v_[1] + *(long *)((long)local_408 + uVar7 + 8) + uVar22;
      local_488.v1L.v_[0]._4_4_ = (uint)(uVar23 >> 0x20);
      uVar17 = local_488.v1H.v_[0] + *(long *)((long)local_408 + uVar7 + 0x10) + uVar24;
      uVar21 = local_488.v1H.v_[1] + *(long *)((long)local_408 + uVar7 + 0x18) + uVar26;
      auVar9._4_4_ = local_488.v0L.v_[0]._4_4_;
      auVar9._0_4_ = local_488.v0L.v_[0]._4_4_;
      auVar9._8_4_ = local_488.v0L.v_[0]._4_4_;
      auVar9._12_4_ = local_488.v0L.v_[0]._4_4_;
      uVar18 = (ulong)local_488.v0L.v_[0]._4_4_ * (uVar23 & 0xffffffff) ^ uVar18;
      uVar22 = (auVar9._8_8_ & 0xffffffff) * (uVar25 & 0xffffffff) ^ uVar22;
      uVar24 = (uVar30 >> 0x20) * (uVar17 & 0xffffffff) ^ uVar24;
      uVar26 = (uVar33 >> 0x20) * (uVar21 & 0xffffffff) ^ uVar26;
      uVar29 = local_488.v0L.v_[0] + uVar31;
      uVar32 = local_488.v0L.v_[1] + uVar34;
      auVar11._4_4_ = local_488.v1L.v_[0]._4_4_;
      auVar11._0_4_ = local_488.v1L.v_[0]._4_4_;
      auVar11._8_4_ = local_488.v1L.v_[0]._4_4_;
      auVar11._12_4_ = local_488.v1L.v_[0]._4_4_;
      uVar13 = uVar30 + uVar16;
      uVar15 = uVar33 + uVar20;
      uVar31 = (ulong)local_488.v1L.v_[0]._4_4_ * (uVar29 & 0xffffffff) ^ uVar31;
      uVar34 = (auVar11._8_8_ & 0xffffffff) * (uVar32 & 0xffffffff) ^ uVar34;
      auVar2._8_8_ = uVar25;
      auVar2._0_8_ = uVar23;
      auVar28 = pshufb(auVar2,_DAT_00112230);
      local_488.v0L.v_[0] = auVar28._0_8_ + uVar29;
      local_488.v0L.v_[1] = auVar28._8_8_ + uVar32;
      auVar4._8_8_ = uVar21;
      auVar4._0_8_ = uVar17;
      auVar28 = pshufb(auVar4,_DAT_00112230);
      uVar30 = auVar28._0_8_ + uVar13;
      uVar33 = auVar28._8_8_ + uVar15;
      local_488.v0H.v_[1]._0_4_ = (undefined4)uVar33;
      local_488.v0H.v_[1]._4_4_ = (undefined4)(uVar33 >> 0x20);
      auVar28 = pshufb((undefined1  [16])local_488.v0L.v_,_DAT_00112230);
      lVar27 = auVar28._0_8_ + uVar23;
      local_488.v1L.v_[1] = auVar28._8_8_ + uVar25;
      auVar28._8_4_ = (undefined4)local_488.v0H.v_[1];
      auVar28._0_8_ = uVar30;
      auVar28._12_4_ = local_488.v0H.v_[1]._4_4_;
      auVar28 = pshufb(auVar28,_DAT_00112230);
      local_488.v1H.v_[0] = auVar28._0_8_ + uVar17;
      local_488.v1H.v_[1] = auVar28._8_8_ + uVar21;
      uVar16 = (uVar17 >> 0x20) * (uVar13 & 0xffffffff) ^ uVar16;
      uVar20 = (uVar21 >> 0x20) * (uVar15 & 0xffffffff) ^ uVar20;
      uVar7 = uVar7 + 0x20;
      local_488.mul0L.v_[0] = uVar18;
      local_488.mul0L.v_[1] = uVar22;
      local_488.mul0H.v_[0] = uVar24;
      local_488.mul0H.v_[1] = uVar26;
      local_488.mul1L.v_[0] = uVar31;
      local_488.mul1L.v_[1] = uVar34;
      local_488.mul1H.v_[0] = uVar16;
      local_488.mul1H.v_[1] = uVar20;
      local_488.v0H.v_[0] = uVar30;
      local_488.v0H.v_[1] = uVar33;
      local_488.v1L.v_[0] = lVar27;
    } while (uVar7 < uVar8);
  }
  uVar30 = local_488.v0H.v_[0];
  uVar33 = local_488.v0H.v_[1];
  if (uVar14 != 0) {
    SSE41::HHStateSSE41::UpdateRemainder(&local_488,(char *)((long)local_408 + uVar8),uVar14);
    uVar30 = local_488.v0H.v_[0];
    uVar33 = local_488.v0H.v_[1];
  }
  iVar6 = 4;
  do {
    local_488.v0H.v_[1]._0_4_ = (undefined4)uVar33;
    local_488.v0H.v_[0]._4_4_ = (uint)(uVar30 >> 0x20);
    local_488.v0H.v_[0]._0_4_ = (undefined4)uVar30;
    auVar10._0_8_ = CONCAT44((undefined4)local_488.v0L.v_[0],local_488.v0L.v_[0]._4_4_);
    auVar10._8_4_ = local_488.v0L.v_[1]._4_4_;
    auVar10._12_4_ = (undefined4)local_488.v0L.v_[1];
    auVar19._0_8_ = CONCAT44((undefined4)local_488.v0H.v_[0],local_488.v0H.v_[0]._4_4_);
    auVar19._8_4_ = local_488.v0H.v_[0]._4_4_;
    auVar19._12_4_ = (undefined4)local_488.v0H.v_[1];
    uVar18 = auVar19._0_8_ + local_488.v1L.v_[0] + local_488.mul0L.v_[0];
    uVar22 = auVar19._8_8_ + local_488.v1L.v_[1] + local_488.mul0L.v_[1];
    local_488.v1L.v_[0]._4_4_ = (uint)(uVar18 >> 0x20);
    uVar14 = local_488.v1H.v_[0] + auVar10._0_8_ + local_488.mul0H.v_[0];
    uVar8 = local_488.v1H.v_[1] + auVar10._8_8_ + local_488.mul0H.v_[1];
    local_488.mul0L.v_[0] =
         (ulong)local_488.v0L.v_[0]._4_4_ * (uVar18 & 0xffffffff) ^ local_488.mul0L.v_[0];
    local_488.mul0L.v_[1] =
         (auVar10._8_8_ & 0xffffffff) * (uVar22 & 0xffffffff) ^ local_488.mul0L.v_[1];
    local_488.mul0H.v_[0] =
         local_488.mul0H.v_[0] ^ (ulong)local_488.v0H.v_[0]._4_4_ * (uVar14 & 0xffffffff);
    local_488.mul0H.v_[1] = local_488.mul0H.v_[1] ^ (uVar33 >> 0x20) * (uVar8 & 0xffffffff);
    uVar31 = local_488.v0L.v_[0] + local_488.mul1L.v_[0];
    uVar34 = local_488.v0L.v_[1] + local_488.mul1L.v_[1];
    auVar12._4_4_ = local_488.v1L.v_[0]._4_4_;
    auVar12._0_4_ = local_488.v1L.v_[0]._4_4_;
    auVar12._8_4_ = local_488.v1L.v_[0]._4_4_;
    auVar12._12_4_ = local_488.v1L.v_[0]._4_4_;
    uVar24 = uVar30 + local_488.mul1H.v_[0];
    uVar26 = uVar33 + local_488.mul1H.v_[1];
    local_488.mul1L.v_[0] =
         (ulong)local_488.v1L.v_[0]._4_4_ * (uVar31 & 0xffffffff) ^ local_488.mul1L.v_[0];
    local_488.mul1L.v_[1] =
         (auVar12._8_8_ & 0xffffffff) * (uVar34 & 0xffffffff) ^ local_488.mul1L.v_[1];
    auVar3._8_8_ = uVar22;
    auVar3._0_8_ = uVar18;
    auVar28 = pshufb(auVar3,_DAT_00112230);
    local_488.v0L.v_[0] = auVar28._0_8_ + uVar31;
    local_488.v0L.v_[1] = auVar28._8_8_ + uVar34;
    auVar5._8_8_ = uVar8;
    auVar5._0_8_ = uVar14;
    auVar28 = pshufb(auVar5,_DAT_00112230);
    uVar30 = auVar28._0_8_ + uVar24;
    uVar33 = auVar28._8_8_ + uVar26;
    local_488.v0H.v_[1]._0_4_ = (undefined4)uVar33;
    local_488.v0H.v_[1]._4_4_ = (undefined4)(uVar33 >> 0x20);
    auVar28 = pshufb((undefined1  [16])local_488.v0L.v_,_DAT_00112230);
    local_488.v1L.v_[0] = auVar28._0_8_ + uVar18;
    local_488.v1L.v_[1] = auVar28._8_8_ + uVar22;
    auVar1._8_4_ = (undefined4)local_488.v0H.v_[1];
    auVar1._0_8_ = uVar30;
    auVar1._12_4_ = local_488.v0H.v_[1]._4_4_;
    auVar28 = pshufb(auVar1,_DAT_00112230);
    local_488.v1H.v_[0] = auVar28._0_8_ + uVar14;
    local_488.v1H.v_[1] = auVar28._8_8_ + uVar8;
    local_488.mul1H.v_[0] = local_488.mul1H.v_[0] ^ (uVar14 >> 0x20) * (uVar24 & 0xffffffff);
    local_488.mul1H.v_[1] = local_488.mul1H.v_[1] ^ (uVar8 >> 0x20) * (uVar26 & 0xffffffff);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return local_488.mul1L.v_[0] + local_488.v1L.v_[0] + local_488.v0L.v_[0] + local_488.mul0L.v_[0];
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}